

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

opensshcert_key * opensshcert_new_shared(ssh_keyalg *self,ptrlen blob,strbuf **basepub_out)

{
  blob_fmt *pbVar1;
  _Bool _Var2;
  strbuf *psVar3;
  uint64_t uVar4;
  unsigned_long uVar5;
  ptrlen pVar6;
  undefined1 local_a8 [8];
  BlobTransformer bt [1];
  strbuf *basepub;
  opensshcert_key *ck;
  undefined1 local_68 [8];
  BinarySource src [1];
  opensshcert_extra *extra;
  strbuf **basepub_out_local;
  ssh_keyalg *self_local;
  ptrlen blob_local;
  
  pbVar1 = (blob_fmt *)self->extra;
  BinarySource_INIT__((BinarySource *)local_68,blob);
  pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
  _Var2 = ptrlen_eq_string(pVar6,(char *)pbVar1[3].fmt);
  if (_Var2) {
    blob_local.len = (size_t)safemalloc(1,0x70,0);
    memset((void *)blob_local.len,0,0x70);
    *(ssh_keyalg **)(blob_local.len + 0x68) = self;
    pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    psVar3 = strbuf_dup(pVar6);
    *(strbuf **)blob_local.len = psVar3;
    bt[0].nparts = (size_t)strbuf_new();
    BinarySink_put_stringz(((strbuf *)bt[0].nparts)->binarysink_,(char *)pbVar1[3].len);
    memset(local_a8,0,0x10);
    blobtrans_read((BlobTransformer *)local_a8,(BinarySource *)local_68,*pbVar1);
    blobtrans_write((BlobTransformer *)local_a8,(BinarySink *)(bt[0].nparts + 0x18),*pbVar1);
    blobtrans_clear((BlobTransformer *)local_a8);
    uVar4 = BinarySource_get_uint64((BinarySource *)src[0]._24_8_);
    *(uint64_t *)(blob_local.len + 8) = uVar4;
    uVar5 = BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
    *(int *)(blob_local.len + 0x10) = (int)uVar5;
    pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    psVar3 = strbuf_dup(pVar6);
    *(strbuf **)(blob_local.len + 0x18) = psVar3;
    pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    psVar3 = strbuf_dup(pVar6);
    *(strbuf **)(blob_local.len + 0x20) = psVar3;
    uVar4 = BinarySource_get_uint64((BinarySource *)src[0]._24_8_);
    *(uint64_t *)(blob_local.len + 0x28) = uVar4;
    uVar4 = BinarySource_get_uint64((BinarySource *)src[0]._24_8_);
    *(uint64_t *)(blob_local.len + 0x30) = uVar4;
    pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    psVar3 = strbuf_dup(pVar6);
    *(strbuf **)(blob_local.len + 0x38) = psVar3;
    pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    psVar3 = strbuf_dup(pVar6);
    *(strbuf **)(blob_local.len + 0x40) = psVar3;
    pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    psVar3 = strbuf_dup(pVar6);
    *(strbuf **)(blob_local.len + 0x48) = psVar3;
    pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    psVar3 = strbuf_dup(pVar6);
    *(strbuf **)(blob_local.len + 0x50) = psVar3;
    pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    psVar3 = strbuf_dup(pVar6);
    *(strbuf **)(blob_local.len + 0x58) = psVar3;
    if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
      *basepub_out = (strbuf *)bt[0].nparts;
    }
    else {
      ssh_key_free((ssh_key *)(blob_local.len + 0x68));
      strbuf_free((strbuf *)bt[0].nparts);
      blob_local.len = 0;
    }
  }
  else {
    blob_local.len = 0;
  }
  return (opensshcert_key *)blob_local.len;
}

Assistant:

static opensshcert_key *opensshcert_new_shared(
    const ssh_keyalg *self, ptrlen blob, strbuf **basepub_out)
{
    const opensshcert_extra *extra = self->extra;

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);

    /* Check the initial key-type string */
    if (!ptrlen_eq_string(get_string(src), extra->cert_key_ssh_id))
        return NULL;

    opensshcert_key *ck = snew(opensshcert_key);
    memset(ck, 0, sizeof(*ck));
    ck->sshk.vt = self;

    ck->nonce = strbuf_dup(get_string(src));
    strbuf *basepub = strbuf_new();
    {
        put_stringz(basepub, extra->base_key_ssh_id);

        /* Make the base public key blob out of the public key
         * material in the certificate. This invocation of the
         * blobtrans system doesn't do any format translation, but it
         * does ensure that the right amount of data is copied so that
         * src ends up in the right position to read the remaining
         * certificate fields. */
        BLOBTRANS_DECLARE(bt);
        blobtrans_read(bt, src, extra->pub_fmt);
        blobtrans_write(bt, BinarySink_UPCAST(basepub), extra->pub_fmt);
        blobtrans_clear(bt);
    }
    ck->serial = get_uint64(src);
    ck->type = get_uint32(src);
    ck->key_id = strbuf_dup(get_string(src));
    ck->valid_principals = strbuf_dup(get_string(src));
    ck->valid_after = get_uint64(src);
    ck->valid_before = get_uint64(src);
    ck->critical_options = strbuf_dup(get_string(src));
    ck->extensions = strbuf_dup(get_string(src));
    ck->reserved = strbuf_dup(get_string(src));
    ck->signature_key = strbuf_dup(get_string(src));
    ck->signature = strbuf_dup(get_string(src));


    if (get_err(src)) {
        ssh_key_free(&ck->sshk);
        strbuf_free(basepub);
        return NULL;
    }

    *basepub_out = basepub;
    return ck;
}